

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool libtorrent::aux::anon_unknown_135::compare_disconnect_peer
               (peer_connection *lhs,peer_connection *rhs)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int64_t iVar5;
  undefined4 extraout_var_00;
  long lVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  rep local_60;
  int64_t local_58;
  int64_t rhs_time_connected;
  rep local_48;
  int64_t local_40;
  int64_t lhs_time_connected;
  time_point now;
  int64_t rhs_transferred;
  int64_t lhs_transferred;
  peer_connection *rhs_local;
  peer_connection *lhs_local;
  
  iVar3 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  iVar4 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if (((byte)iVar3 & 1) == ((byte)iVar4 & 1)) {
    bVar1 = peer_connection::is_interesting(lhs);
    bVar2 = peer_connection::is_interesting(rhs);
    if (bVar1 == bVar2) {
      bVar1 = peer_connection::is_seed(lhs);
      bVar2 = peer_connection::is_seed(rhs);
      if (bVar1 == bVar2) {
        bVar1 = peer_connection::on_parole(lhs);
        bVar2 = peer_connection::on_parole(rhs);
        if (bVar1 == bVar2) {
          iVar3 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
          iVar5 = stat::total_payload_download((stat *)CONCAT44(extraout_var,iVar3));
          iVar3 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
          now.__d.__r = (duration)
                        stat::total_payload_download((stat *)CONCAT44(extraout_var_00,iVar3));
          lhs_time_connected = (int64_t)time_now();
          rhs_time_connected = (int64_t)peer_connection::connected_time(lhs);
          local_48 = (rep)::std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&lhs_time_connected,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&rhs_time_connected);
          local_40 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)local_48);
          local_68.__d.__r = (duration)peer_connection::connected_time(rhs);
          local_60 = (rep)::std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&lhs_time_connected,&local_68);
          local_58 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)local_60);
          lVar6 = iVar5 / (local_40 + 1);
          now.__d.__r = (duration)((long)now.__d.__r / (local_58 + 1));
          if ((duration)lVar6 == now.__d.__r) {
            iVar3 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
            iVar4 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
            if (((byte)iVar3 & 1) == ((byte)iVar4 & 1)) {
              local_70.__d.__r = (duration)peer_connection::last_received(lhs);
              local_78.__d.__r = (duration)peer_connection::last_received(rhs);
              lhs_local._7_1_ = ::std::chrono::operator<(&local_70,&local_78);
            }
            else {
              iVar3 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
              lhs_local._7_1_ = (bool)((byte)iVar3 & 1);
            }
          }
          else {
            lhs_local._7_1_ = lVar6 < (long)now.__d.__r;
          }
        }
        else {
          lhs_local._7_1_ = peer_connection::on_parole(lhs);
        }
      }
      else {
        lhs_local._7_1_ = peer_connection::is_seed(rhs);
      }
    }
    else {
      lhs_local._7_1_ = peer_connection::is_interesting(rhs);
    }
  }
  else {
    iVar3 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    lhs_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  return lhs_local._7_1_;
}

Assistant:

bool compare_disconnect_peer(peer_connection const* lhs, peer_connection const* rhs)
	{
		// prefer to disconnect peers that are already disconnecting
		if (lhs->is_disconnecting() != rhs->is_disconnecting())
			return lhs->is_disconnecting();

		// prefer to disconnect peers we're not interested in
		if (lhs->is_interesting() != rhs->is_interesting())
			return rhs->is_interesting();

		// prefer to disconnect peers that are not seeds
		if (lhs->is_seed() != rhs->is_seed())
			return rhs->is_seed();

		// prefer to disconnect peers that are on parole
		if (lhs->on_parole() != rhs->on_parole())
			return lhs->on_parole();

		// prefer to disconnect peers that send data at a lower rate
		std::int64_t lhs_transferred = lhs->statistics().total_payload_download();
		std::int64_t rhs_transferred = rhs->statistics().total_payload_download();

		time_point const now = aux::time_now();
		std::int64_t const lhs_time_connected = total_seconds(now - lhs->connected_time());
		std::int64_t const rhs_time_connected = total_seconds(now - rhs->connected_time());

		lhs_transferred /= lhs_time_connected + 1;
		rhs_transferred /= (rhs_time_connected + 1);
		if (lhs_transferred != rhs_transferred)
			return lhs_transferred < rhs_transferred;

		// prefer to disconnect peers that chokes us
		if (lhs->is_choked() != rhs->is_choked())
			return lhs->is_choked();

		return lhs->last_received() < rhs->last_received();
	}